

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int session_ob_data_push(nghttp2_session *session,nghttp2_stream *stream)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  nghttp2_pq_entry *pnVar5;
  nghttp2_pq *pq;
  
  if ((stream->flags & 0x10) == 0) {
    __assert_fail("stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x397,"int session_ob_data_push(nghttp2_session *, nghttp2_stream *)");
  }
  if (stream->queued == '\0') {
    bVar1 = stream->extpri;
    uVar2 = bVar1 & 0x7f;
    if ((byte)uVar2 < 8) {
      pq = &session->sched[uVar2].ob_data;
      iVar3 = nghttp2_pq_empty(pq);
      if (iVar3 == 0) {
        pnVar5 = nghttp2_pq_top(pq);
        sVar4 = pnVar5[9].index;
      }
      else {
        sVar4 = 0;
      }
      stream->cycle = sVar4;
      if ((char)bVar1 < '\0') {
        stream->cycle = sVar4 + stream->last_writelen;
      }
      iVar3 = nghttp2_pq_push(pq,&stream->pq_entry);
      if (iVar3 == 0) {
        stream->queued = '\x01';
      }
      return iVar3;
    }
    __assert_fail("urgency < NGHTTP2_EXTPRI_URGENCY_LEVELS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x39d,"int session_ob_data_push(nghttp2_session *, nghttp2_stream *)");
  }
  __assert_fail("stream->queued == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                ,0x398,"int session_ob_data_push(nghttp2_session *, nghttp2_stream *)");
}

Assistant:

static int session_ob_data_push(nghttp2_session *session,
                                nghttp2_stream *stream) {
  int rv;
  uint32_t urgency;
  int inc;
  nghttp2_pq *pq;

  assert(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES);
  assert(stream->queued == 0);

  urgency = nghttp2_extpri_uint8_urgency(stream->extpri);
  inc = nghttp2_extpri_uint8_inc(stream->extpri);

  assert(urgency < NGHTTP2_EXTPRI_URGENCY_LEVELS);

  pq = &session->sched[urgency].ob_data;

  stream->cycle = pq_get_first_cycle(pq);
  if (inc) {
    stream->cycle += stream->last_writelen;
  }

  rv = nghttp2_pq_push(pq, &stream->pq_entry);
  if (rv != 0) {
    return rv;
  }

  stream->queued = 1;

  return 0;
}